

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_parse_function_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateTailcallFallbackFunction
          (ParseFunctionGenerator *this,Formatter *format)

{
  Descriptor *descriptor;
  Formatter *pFVar1;
  bool bVar2;
  LogMessage *other;
  pointer pTVar3;
  allocator local_101;
  string local_100;
  allocator local_d9;
  string local_d8;
  allocator local_b1;
  string local_b0;
  allocator local_89;
  string local_88;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  Formatter *local_18;
  Formatter *format_local;
  ParseFunctionGenerator *this_local;
  
  local_18 = format;
  format_local = (Formatter *)this;
  bVar2 = should_generate_tctable(this);
  local_51 = 0;
  if (!bVar2) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_parse_function_generator.cc"
               ,0x178);
    local_51 = 1;
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: should_generate_tctable(): ");
    internal::LogFinisher::operator=(local_65,other);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  Formatter::operator()<>
            (local_18,
             "const char* $classname$::Tct_ParseFallback(PROTOBUF_TC_PARAM_DECL) {\n#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) return nullptr\n"
            );
  Formatter::Indent(local_18);
  Formatter::operator()<>(local_18,"auto* typed_msg = static_cast<$classname$*>(msg);\n");
  if (0 < this->num_hasbits_) {
    Formatter::operator()<>(local_18,"typed_msg->_has_bits_[0] = hasbits;\n");
  }
  pFVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,"msg",&local_89);
  Formatter::Set<char[12]>(pFVar1,&local_88,(char (*) [12])"typed_msg->");
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  pFVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,"this",&local_b1);
  Formatter::Set<char[10]>(pFVar1,&local_b0,(char (*) [10])"typed_msg");
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  pFVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,"has_bits",&local_d9);
  Formatter::Set<char[22]>(pFVar1,&local_d8,(char (*) [22])"typed_msg->_has_bits_");
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  pFVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_100,"next_tag",&local_101);
  Formatter::Set<char[14]>(pFVar1,&local_100,(char (*) [14])"goto next_tag");
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  pFVar1 = local_18;
  descriptor = this->descriptor_;
  pTVar3 = std::
           unique_ptr<google::protobuf::compiler::cpp::TailCallTableInfo,_std::default_delete<google::protobuf::compiler::cpp::TailCallTableInfo>_>
           ::operator->(&this->tc_table_info_);
  GenerateParseIterationBody(this,pFVar1,descriptor,&pTVar3->fallback_fields);
  Formatter::Outdent(local_18);
  Formatter::operator()<>(local_18,"next_tag:\nmessage_done:\n  return ptr;\n#undef CHK_\n}\n");
  return;
}

Assistant:

void ParseFunctionGenerator::GenerateTailcallFallbackFunction(
    Formatter& format) {
  GOOGLE_CHECK(should_generate_tctable());
  format(
      "const char* $classname$::Tct_ParseFallback(PROTOBUF_TC_PARAM_DECL) {\n"
      "#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) return nullptr\n");
  format.Indent();
  format("auto* typed_msg = static_cast<$classname$*>(msg);\n");

  if (num_hasbits_ > 0) {
    // Sync hasbits
    format("typed_msg->_has_bits_[0] = hasbits;\n");
  }

  format.Set("msg", "typed_msg->");
  format.Set("this", "typed_msg");
  format.Set("has_bits", "typed_msg->_has_bits_");
  format.Set("next_tag", "goto next_tag");
  GenerateParseIterationBody(format, descriptor_,
                             tc_table_info_->fallback_fields);

  format.Outdent();
  format(
      "next_tag:\n"
      "message_done:\n"
      "  return ptr;\n"
      "#undef CHK_\n"
      "}\n");
}